

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner-unix.c
# Opt level: O3

long process_output_size(process_info_t *p)

{
  int iVar1;
  long lVar2;
  stat buf;
  stat64 local_90;
  
  iVar1 = fileno((FILE *)p->stdout_file);
  iVar1 = fstat64(iVar1,&local_90);
  lVar2 = -1;
  if (-1 < iVar1) {
    lVar2 = local_90.st_size;
  }
  return lVar2;
}

Assistant:

long int process_output_size(process_info_t *p) {
  /* Size of the p->stdout_file */
  struct stat buf;

  int r = fstat(fileno(p->stdout_file), &buf);
  if (r < 0) {
    return -1;
  }

  return (long)buf.st_size;
}